

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QHash<int,_QVariant>_>::resize(QList<QHash<int,_QVariant>_> *this,qsizetype size)

{
  Data *pDVar1;
  QHash<int,_QVariant> *pQVar2;
  qsizetype qVar3;
  long lVar4;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (pQVar2 = (this->d).ptr,
     (pDVar1->super_QArrayData).alloc -
     ((long)((long)pQVar2 -
            ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) <
     size)) {
    QArrayDataPointer<QHash<int,_QVariant>_>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QHash<int,_QVariant> **)0x0,
               (QArrayDataPointer<QHash<int,_QVariant>_> *)0x0);
    qVar3 = (this->d).size;
  }
  else {
    qVar3 = (this->d).size;
    if (size < qVar3) {
      pQVar2 = pQVar2 + size;
      lVar4 = qVar3 * 8 + size * -8;
      do {
        QHash<int,_QVariant>::~QHash(pQVar2);
        pQVar2 = pQVar2 + 1;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
      goto LAB_0012dbb3;
    }
  }
  if (size - qVar3 == 0 || size < qVar3) {
    return;
  }
  memset((this->d).ptr + qVar3,0,(size - qVar3) * 8);
LAB_0012dbb3:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }